

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O1

_Bool get_ini_data(OpenJTalk *oj)

{
  bool bVar1;
  _Bool _Var2;
  ConfigScanner *sc;
  ConfigItem *pCVar3;
  ulong uVar4;
  char *unaff_R15;
  double dVar5;
  double temp_double;
  int temp_int;
  double local_38;
  uint local_2c;
  
  if (g_ini_path[0] == '\0') {
    return false;
  }
  if (g_verbose) {
    get_ini_data_cold_1();
  }
  sc = config_load(g_ini_path);
  if (sc == (ConfigScanner *)0x0) {
    return sc != (ConfigScanner *)0x0;
  }
  pCVar3 = config_find(sc,G_SECTION_NAME,"voice_dir");
  if ((pCVar3 == (ConfigItem *)0x0) || (pCVar3->vtype != VTYPE_STRING)) {
    bVar1 = false;
  }
  else {
    unaff_R15 = (pCVar3->value).v_string;
    bVar1 = true;
  }
  if (bVar1) {
    if (oj->dn_voice_dir_path[0] == '\0') {
      if (g_verbose != false) {
        fprintf(_stderr,anon_var_dwarf_60d,unaff_R15);
      }
      set_config_voice_dir(oj,unaff_R15);
    }
    else if (g_verbose != false) {
      get_ini_data_cold_2();
    }
  }
  pCVar3 = config_find(sc,G_SECTION_NAME,"dic_dir");
  if ((pCVar3 == (ConfigItem *)0x0) || (pCVar3->vtype != VTYPE_STRING)) {
    bVar1 = false;
  }
  else {
    unaff_R15 = (pCVar3->value).v_string;
    bVar1 = true;
  }
  if (bVar1) {
    if (oj->dn_dic_path[0] == '\0') {
      _Var2 = set_config_dic_dir(oj,unaff_R15);
      if ((_Var2) || (g_verbose == false)) goto LAB_0013f3b6;
    }
    else if (g_verbose != true) goto LAB_0013f3b6;
    get_ini_data_cold_3();
  }
LAB_0013f3b6:
  pCVar3 = config_find(sc,G_SECTION_NAME,"voice");
  if ((pCVar3 == (ConfigItem *)0x0) || (pCVar3->vtype != VTYPE_STRING)) {
    bVar1 = false;
  }
  else {
    unaff_R15 = (pCVar3->value).v_string;
    bVar1 = true;
  }
  if (bVar1) {
    if (oj->fn_voice_path[0] == '\0') {
      if (g_verbose != false) {
        fprintf(_stderr,anon_var_dwarf_65c,unaff_R15);
      }
      set_config_voice(oj,unaff_R15);
    }
    else if (g_verbose != false) {
      get_ini_data_cold_4();
    }
  }
  _Var2 = config_find_integer(sc,G_SECTION_NAME,"sampling_frequency",(int *)&local_2c);
  if (_Var2) {
    if (g_verbose == true) {
      get_ini_data_cold_5();
    }
    if (oj == (OpenJTalk *)0x0) {
      g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
    }
    else {
      uVar4 = (ulong)local_2c;
      oj->errorCode = OPENJTALKERROR_NO_ERROR;
      if (uVar4 == 0) {
        oj->errorCode = OPENJTALKERROR_VALUE_ERROR;
      }
      else {
        oj->sampling_frequency = uVar4;
        Open_JTalk_set_sampling_frequency(oj->open_jtalk,uVar4);
      }
    }
  }
  _Var2 = config_find_integer(sc,G_SECTION_NAME,"s",(int *)&local_2c);
  if (_Var2) {
    if (g_verbose == true) {
      get_ini_data_cold_6();
    }
    if (oj == (OpenJTalk *)0x0) {
      g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
    }
    else {
      uVar4 = (ulong)local_2c;
      oj->errorCode = OPENJTALKERROR_NO_ERROR;
      if (uVar4 == 0) {
        oj->errorCode = OPENJTALKERROR_VALUE_ERROR;
      }
      else {
        oj->sampling_frequency = uVar4;
        Open_JTalk_set_sampling_frequency(oj->open_jtalk,uVar4);
      }
    }
  }
  _Var2 = config_find_integer(sc,G_SECTION_NAME,"fperiod",(int *)&local_2c);
  if (_Var2) {
    if (g_verbose == true) {
      get_ini_data_cold_7();
    }
    if (oj == (OpenJTalk *)0x0) {
      g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
    }
    else {
      oj->errorCode = OPENJTALKERROR_NO_ERROR;
      uVar4 = (ulong)(local_2c + (local_2c == 0));
      oj->fperiod = uVar4;
      Open_JTalk_set_fperiod(oj->open_jtalk,uVar4);
    }
  }
  _Var2 = config_find_integer(sc,G_SECTION_NAME,"p",(int *)&local_2c);
  if (_Var2) {
    if (g_verbose == true) {
      get_ini_data_cold_8();
    }
    if (oj == (OpenJTalk *)0x0) {
      g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
    }
    else {
      oj->errorCode = OPENJTALKERROR_NO_ERROR;
      uVar4 = (ulong)(local_2c + (local_2c == 0));
      oj->fperiod = uVar4;
      Open_JTalk_set_fperiod(oj->open_jtalk,uVar4);
    }
  }
  _Var2 = config_find_double(sc,G_SECTION_NAME,"alpha",&local_38);
  if (_Var2) {
    if (g_verbose == true) {
      get_ini_data_cold_9();
    }
    openjtalk_setAlpha(oj,local_38);
  }
  _Var2 = config_find_double(sc,G_SECTION_NAME,"a",&local_38);
  if (_Var2) {
    if (g_verbose == true) {
      get_ini_data_cold_10();
    }
    openjtalk_setAlpha(oj,local_38);
  }
  _Var2 = config_find_double(sc,G_SECTION_NAME,"beta",&local_38);
  if (_Var2) {
    if (g_verbose == true) {
      get_ini_data_cold_11();
    }
    openjtalk_setBeta(oj,local_38);
  }
  _Var2 = config_find_double(sc,G_SECTION_NAME,"b",&local_38);
  if (_Var2) {
    if (g_verbose == true) {
      get_ini_data_cold_12();
    }
    openjtalk_setBeta(oj,local_38);
  }
  _Var2 = config_find_double(sc,G_SECTION_NAME,"speed",&local_38);
  if (_Var2) {
    if (g_verbose == true) {
      get_ini_data_cold_13();
    }
    if (oj == (OpenJTalk *)0x0) {
      g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
    }
    else {
      dVar5 = 0.0;
      if (0.0 <= local_38) {
        dVar5 = local_38;
      }
      oj->errorCode = OPENJTALKERROR_NO_ERROR;
      oj->speed = dVar5;
      Open_JTalk_set_speed(oj->open_jtalk,dVar5);
    }
  }
  _Var2 = config_find_double(sc,G_SECTION_NAME,"r",&local_38);
  if (_Var2) {
    if (g_verbose == true) {
      get_ini_data_cold_14();
    }
    if (oj == (OpenJTalk *)0x0) {
      g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
    }
    else {
      dVar5 = 0.0;
      if (0.0 <= local_38) {
        dVar5 = local_38;
      }
      oj->errorCode = OPENJTALKERROR_NO_ERROR;
      oj->speed = dVar5;
      Open_JTalk_set_speed(oj->open_jtalk,dVar5);
    }
  }
  _Var2 = config_find_double(sc,G_SECTION_NAME,"additional_half_tone",&local_38);
  if (_Var2) {
    if (g_verbose == true) {
      get_ini_data_cold_15();
    }
    if (oj == (OpenJTalk *)0x0) {
      g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
    }
    else {
      oj->errorCode = OPENJTALKERROR_NO_ERROR;
      oj->additional_half_tone = local_38;
      Open_JTalk_set_additional_half_tone(oj->open_jtalk,local_38);
    }
  }
  _Var2 = config_find_double(sc,G_SECTION_NAME,"fm",&local_38);
  if (_Var2) {
    if (g_verbose == true) {
      get_ini_data_cold_16();
    }
    if (oj == (OpenJTalk *)0x0) {
      g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
    }
    else {
      oj->errorCode = OPENJTALKERROR_NO_ERROR;
      oj->additional_half_tone = local_38;
      Open_JTalk_set_additional_half_tone(oj->open_jtalk,local_38);
    }
  }
  _Var2 = config_find_double(sc,G_SECTION_NAME,"msd_threshold",&local_38);
  if (_Var2) {
    if (g_verbose == true) {
      get_ini_data_cold_17();
    }
    openjtalk_setMsdThreshold(oj,local_38);
  }
  _Var2 = config_find_double(sc,G_SECTION_NAME,"u",&local_38);
  if (_Var2) {
    if (g_verbose == true) {
      get_ini_data_cold_18();
    }
    openjtalk_setMsdThreshold(oj,local_38);
  }
  _Var2 = config_find_double(sc,G_SECTION_NAME,"gv_weight_for_spectrum",&local_38);
  if (_Var2) {
    if (g_verbose == true) {
      get_ini_data_cold_19();
    }
    if (oj == (OpenJTalk *)0x0) {
      g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
    }
    else {
      dVar5 = 0.0;
      if (0.0 <= local_38) {
        dVar5 = local_38;
      }
      oj->errorCode = OPENJTALKERROR_NO_ERROR;
      oj->gv_weight0 = dVar5;
      Open_JTalk_set_gv_weight(oj->open_jtalk,0,dVar5);
    }
  }
  _Var2 = config_find_double(sc,G_SECTION_NAME,"jm",&local_38);
  if (_Var2) {
    if (g_verbose == true) {
      get_ini_data_cold_20();
    }
    if (oj == (OpenJTalk *)0x0) {
      g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
    }
    else {
      dVar5 = 0.0;
      if (0.0 <= local_38) {
        dVar5 = local_38;
      }
      oj->errorCode = OPENJTALKERROR_NO_ERROR;
      oj->gv_weight0 = dVar5;
      Open_JTalk_set_gv_weight(oj->open_jtalk,0,dVar5);
    }
  }
  _Var2 = config_find_double(sc,G_SECTION_NAME,"gv_weight_for_log_f0",&local_38);
  if (_Var2) {
    if (g_verbose == true) {
      get_ini_data_cold_21();
    }
    if (oj == (OpenJTalk *)0x0) {
      g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
    }
    else {
      dVar5 = 0.0;
      if (0.0 <= local_38) {
        dVar5 = local_38;
      }
      oj->errorCode = OPENJTALKERROR_NO_ERROR;
      oj->gv_weight1 = dVar5;
      Open_JTalk_set_gv_weight(oj->open_jtalk,1,dVar5);
    }
  }
  _Var2 = config_find_double(sc,G_SECTION_NAME,"jf",&local_38);
  if (_Var2) {
    if (g_verbose == true) {
      get_ini_data_cold_22();
    }
    if (oj == (OpenJTalk *)0x0) {
      g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
    }
    else {
      dVar5 = 0.0;
      if (0.0 <= local_38) {
        dVar5 = local_38;
      }
      oj->errorCode = OPENJTALKERROR_NO_ERROR;
      oj->gv_weight1 = dVar5;
      Open_JTalk_set_gv_weight(oj->open_jtalk,1,dVar5);
    }
  }
  _Var2 = config_find_double(sc,G_SECTION_NAME,"volume",&local_38);
  if (_Var2) {
    if (g_verbose == true) {
      get_ini_data_cold_23();
    }
    if (oj == (OpenJTalk *)0x0) {
      g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
    }
    else {
      oj->errorCode = OPENJTALKERROR_NO_ERROR;
      oj->volume = local_38;
      Open_JTalk_set_volume(oj->open_jtalk,local_38);
    }
  }
  _Var2 = config_find_double(sc,G_SECTION_NAME,"g",&local_38);
  if (_Var2) {
    if (g_verbose == true) {
      get_ini_data_cold_24();
    }
    if (oj == (OpenJTalk *)0x0) {
      g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
    }
    else {
      oj->errorCode = OPENJTALKERROR_NO_ERROR;
      oj->volume = local_38;
      Open_JTalk_set_volume(oj->open_jtalk,local_38);
    }
  }
  config_free(sc);
  if (g_verbose == true) {
    get_ini_data_cold_25();
  }
  return true;
}

Assistant:

bool get_ini_data(OpenJTalk *oj)
{
	if (strlen(g_ini_path) == 0)
	{
		return false;
	}

	if (g_verbose)
	{
		console_message(u8"***** 設定ファイル解釈　開始 *****\n");
	}

	ConfigScanner *sc = config_load(g_ini_path);
	if (sc == NULL)
	{
		return false;
	}

	char *temp;
	if (config_find_string(sc, G_SECTION_NAME, u8"voice_dir", &temp))
	{
		if (strlen(oj->dn_voice_dir_path) == 0)
		{
			if (g_verbose)
			{
				console_message_string(u8"config voice_dir： %s\n", temp);
			}
			set_config_voice_dir(oj, temp);
		}
		else
		{
			if (g_verbose)
			{
				console_message(u8"config voice_dir: 無視\n");
			}
		}
	}

	if (config_find_string(sc, G_SECTION_NAME, u8"dic_dir", &temp))
	{
		if (strlen(oj->dn_dic_path) == 0)
		{
			if (!set_config_dic_dir(oj, temp))
			{
				if (g_verbose)
				{
					console_message(u8"warning: 設定ファイルからの辞書ファイルの設定に失敗しました。\n");
				}
			}
		}
		else
		{
			if (g_verbose)
			{
				console_message(u8"config dic_dir: 無視\n");
			}
		}
	}

	if (config_find_string(sc, G_SECTION_NAME, u8"voice", &temp))
	{
		if (strlen(oj->fn_voice_path) == 0)
		{
			if (g_verbose)
			{
				console_message_string(u8"config voice： %s\n", temp);
			}
			set_config_voice(oj, temp);
		}
		else
		{
			if (g_verbose)
			{
				console_message(u8"config voice: 無視\n");
			}
		}
	}

	int temp_int;
	if (config_find_integer(sc, G_SECTION_NAME, u8"sampling_frequency", &temp_int))
	{
		if (g_verbose)
		{
			console_message_integer(u8"config sampling_frequency: %d\n", temp_int);
		}
		openjtalk_setSamplingFrequency(oj, temp_int);
	}
	if (config_find_integer(sc, G_SECTION_NAME, u8"s", &temp_int))
	{
		if (g_verbose)
		{
			console_message_integer(u8"config s: %d\n", temp_int);
		}
		openjtalk_setSamplingFrequency(oj, temp_int);
	}
	if (config_find_integer(sc, G_SECTION_NAME, u8"fperiod", &temp_int))
	{
		if (g_verbose)
		{
			console_message_integer(u8"config fperiod: %d\n", temp_int);
		}
		openjtalk_setFperiod(oj, temp_int);
	}
	if (config_find_integer(sc, G_SECTION_NAME, u8"p", &temp_int))
	{
		if (g_verbose)
		{
			console_message_integer(u8"config p: %d\n", temp_int);
		}
		openjtalk_setFperiod(oj, temp_int);
	}

	double temp_double;
	if (config_find_double(sc, G_SECTION_NAME, u8"alpha", &temp_double))
	{
		if (g_verbose)
		{
			console_message_float(u8"config alpha: %f\n", temp_double);
		}
		openjtalk_setAlpha(oj, temp_double);
	}
	if (config_find_double(sc, G_SECTION_NAME, u8"a", &temp_double))
	{
		if (g_verbose)
		{
			console_message_float(u8"config a: %f\n", temp_double);
		}
		openjtalk_setAlpha(oj, temp_double);
	}
	if (config_find_double(sc, G_SECTION_NAME, u8"beta", &temp_double))
	{
		if (g_verbose)
		{
			console_message_float(u8"config beta: %f\n", temp_double);
		}
		openjtalk_setBeta(oj, temp_double);
	}
	if (config_find_double(sc, G_SECTION_NAME, u8"b", &temp_double))
	{
		if (g_verbose)
		{
			console_message_float(u8"config b: %f\n", temp_double);
		}
		openjtalk_setBeta(oj, temp_double);
	}
	if (config_find_double(sc, G_SECTION_NAME, u8"speed", &temp_double))
	{
		if (g_verbose)
		{
			console_message_float(u8"config speed: %f\n", temp_double);
		}
		openjtalk_setSpeed(oj, temp_double);
	}
	if (config_find_double(sc, G_SECTION_NAME, u8"r", &temp_double))
	{
		if (g_verbose)
		{
			console_message_float(u8"config r: %f\n", temp_double);
		}
		openjtalk_setSpeed(oj, temp_double);
	}
	if (config_find_double(sc, G_SECTION_NAME, u8"additional_half_tone", &temp_double))
	{
		if (g_verbose)
		{
			console_message_float(u8"config additional_half_tone: %f\n", temp_double);
		}
		openjtalk_setAdditionalHalfTone(oj, temp_double);
	}
	if (config_find_double(sc, G_SECTION_NAME, u8"fm", &temp_double))
	{
		if (g_verbose)
		{
			console_message_float(u8"config fm: %f\n", temp_double);
		}
		openjtalk_setAdditionalHalfTone(oj, temp_double);
	}
	if (config_find_double(sc, G_SECTION_NAME, u8"msd_threshold", &temp_double))
	{
		if (g_verbose)
		{
			console_message_float(u8"config msd_threshold: %f\n", temp_double);
		}
		openjtalk_setMsdThreshold(oj, temp_double);
	}
	if (config_find_double(sc, G_SECTION_NAME, u8"u", &temp_double))
	{
		if (g_verbose)
		{
			console_message_integer(u8"config u: %f\n", temp_double);
		}
		openjtalk_setMsdThreshold(oj, temp_double);
	}
	if (config_find_double(sc, G_SECTION_NAME, u8"gv_weight_for_spectrum", &temp_double))
	{
		if (g_verbose)
		{
			console_message_float(u8"config gv_weight_for_spectrum: %f\n", temp_double);
		}
		openjtalk_setGvWeightForSpectrum(oj, temp_double);
	}
	if (config_find_double(sc, G_SECTION_NAME, u8"jm", &temp_double))
	{
		if (g_verbose)
		{
			console_message_float(u8"config jm： %f\n", temp_double);
		}
		openjtalk_setGvWeightForSpectrum(oj, temp_double);
	}
	if (config_find_double(sc, G_SECTION_NAME, u8"gv_weight_for_log_f0", &temp_double))
	{
		if (g_verbose)
		{
			console_message_float(u8"config gv_weight_for_log_f0: %f\n", temp_double);
		}
		openjtalk_setGvWeightForLogF0(oj, temp_double);
	}
	if (config_find_double(sc, G_SECTION_NAME, u8"jf", &temp_double))
	{
		if (g_verbose)
		{
			console_message_float(u8"config jf: %f\n", temp_double);
		}
		openjtalk_setGvWeightForLogF0(oj, temp_double);
	}
	if (config_find_double(sc, G_SECTION_NAME, u8"volume", &temp_double))
	{
		if (g_verbose)
		{
			console_message_float(u8"config volume: %f\n", temp_double);
		}
		openjtalk_setVolume(oj, temp_double);
	}
	if (config_find_double(sc, G_SECTION_NAME, u8"g", &temp_double))
	{
		if (g_verbose)
		{
			console_message_float(u8"config g: %f\n", temp_double);
		}
		openjtalk_setVolume(oj, temp_double);
	}
	config_free(sc);
	if (g_verbose)
	{
		console_message(u8"***** 設定ファイル解釈　終了 *****\n");
	}
	return true;
}